

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_exp_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *E,mbedtls_mpi *N,
                       mbedtls_mpi *prec_RR)

{
  short *X_00;
  short sVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  mbedtls_mpi_uint mm;
  undefined8 uVar7;
  ulong uVar8;
  ulong idx;
  ulong uVar9;
  mbedtls_mpi_uint *T;
  bool bVar10;
  mbedtls_mpi_uint local_e0;
  mbedtls_mpi_uint z;
  mbedtls_mpi local_d0;
  ulong local_c0;
  ulong local_b8;
  undefined8 local_b0;
  mbedtls_mpi_uint *local_a8;
  undefined1 local_a0 [8];
  mbedtls_mpi Apos;
  undefined1 auStack_78 [8];
  mbedtls_mpi RR;
  mbedtls_mpi Y;
  
  auStack_78 = (undefined1  [8])0x0;
  Y.p = (mbedtls_mpi_uint *)CONCAT44(Y.p._4_4_,0x10001);
  z = (mbedtls_mpi_uint)X;
  RR._8_8_ = auStack_78;
  iVar5 = mbedtls_mpi_cmp_mpi(N,(mbedtls_mpi *)&RR.s);
  if (iVar5 < 1) {
    return -4;
  }
  if ((*N->p & 1) == 0) {
    return -4;
  }
  auStack_78 = (undefined1  [8])0x0;
  Y.p = (mbedtls_mpi_uint *)CONCAT44(Y.p._4_4_,0x10001);
  RR._8_8_ = auStack_78;
  iVar5 = mbedtls_mpi_cmp_mpi(E,(mbedtls_mpi *)&RR.s);
  if (iVar5 < 0) {
    return -4;
  }
  sVar6 = mbedtls_mpi_core_bitlen(E->p,(ulong)E->n);
  if (0x100 < sVar6) {
    return -4;
  }
  sVar6 = mbedtls_mpi_core_bitlen(N->p,(ulong)N->n);
  if (0x100 < sVar6) {
    return -4;
  }
  mm = mbedtls_mpi_core_montmul_init(N->p);
  RR.p = (mbedtls_mpi_uint *)CONCAT44(RR.p._4_4_,1);
  auStack_78 = (undefined1  [8])0x0;
  local_d0.s = 1;
  local_d0.n = 0;
  local_d0.p = (mbedtls_mpi_uint *)0x0;
  Apos.p._0_4_ = 1;
  local_a0 = (undefined1  [8])0x0;
  Apos.s = 0;
  Apos.n = 0;
  Apos._12_4_ = 0;
  RR.s = 0;
  RR.n = 0;
  RR._12_4_ = 0;
  Y.p = (mbedtls_mpi_uint *)0x0;
  Y.s = 0;
  Y.n = 0;
  Y._12_4_ = 0;
  mbedtls_mpi_core_bitlen(E->p,(ulong)E->n);
  Y.p = (mbedtls_mpi_uint *)CONCAT44(Y.p._4_4_,1);
  RR.s = 0;
  RR.n = 0;
  RR._12_4_ = 0;
  sVar6 = (ulong)N->n + 1;
  iVar5 = mbedtls_mpi_grow((mbedtls_mpi *)&RR.s,sVar6);
  if (((iVar5 == 0) && (iVar5 = mbedtls_mpi_grow((mbedtls_mpi *)&Y.s,sVar6), iVar5 == 0)) &&
     (iVar5 = mbedtls_mpi_grow(&local_d0,(ulong)(uint)((int)sVar6 * 2)), iVar5 == 0)) {
    sVar1 = A->s;
    if (sVar1 == -1) {
      iVar5 = mbedtls_mpi_copy((mbedtls_mpi *)local_a0,A);
      if (iVar5 != 0) goto LAB_0021168e;
      Apos.p._0_2_ = 1;
      A = (mbedtls_mpi *)local_a0;
    }
    if ((prec_RR == (mbedtls_mpi *)0x0) || (prec_RR->p == (mbedtls_mpi_uint *)0x0)) {
      iVar5 = mbedtls_mpi_lset((mbedtls_mpi *)auStack_78,1);
      if ((iVar5 != 0) ||
         ((iVar5 = mbedtls_mpi_shift_l((mbedtls_mpi *)auStack_78,(ulong)N->n << 7), iVar5 != 0 ||
          (iVar5 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)auStack_78,(mbedtls_mpi *)auStack_78,N),
          iVar5 != 0)))) goto LAB_0021168e;
      if (prec_RR != (mbedtls_mpi *)0x0) {
        prec_RR->p = (mbedtls_mpi_uint *)auStack_78;
        *(mbedtls_mpi_uint **)&prec_RR->s = RR.p;
      }
    }
    else {
      auStack_78 = (undefined1  [8])prec_RR->p;
      RR.p = *(mbedtls_mpi_uint **)&prec_RR->s;
    }
    iVar5 = mbedtls_mpi_cmp_mpi(A,N);
    X_00 = &Y.s;
    if (iVar5 < 0) {
      iVar5 = mbedtls_mpi_copy((mbedtls_mpi *)X_00,A);
    }
    else {
      iVar5 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)X_00,A,N);
      if (iVar5 != 0) goto LAB_0021168e;
      iVar5 = mbedtls_mpi_grow((mbedtls_mpi *)X_00,(ulong)N->n + 1);
    }
    if (iVar5 == 0) {
      local_a8 = local_d0.p;
      mbedtls_mpi_core_montmul
                ((mbedtls_mpi_uint *)Y._8_8_,(mbedtls_mpi_uint *)Y._8_8_,
                 (mbedtls_mpi_uint *)auStack_78,(ulong)RR.p >> 0x10 & 0xffff,N->p,(ulong)N->n,mm,
                 local_d0.p);
      iVar5 = mbedtls_mpi_copy((mbedtls_mpi *)&RR.s,(mbedtls_mpi *)auStack_78);
      T = local_a8;
      if (iVar5 == 0) {
        local_e0 = 1;
        mbedtls_mpi_core_montmul
                  ((mbedtls_mpi_uint *)RR._8_8_,(mbedtls_mpi_uint *)RR._8_8_,&local_e0,1,N->p,
                   (ulong)N->n,mm,local_a8);
        uVar7 = 0;
        uVar8 = (ulong)E->n;
        uVar9 = 0;
        bVar3 = false;
LAB_0021193b:
        bVar2 = (byte)uVar7;
        if (uVar9 == 0) {
          if (uVar8 == 0) goto LAB_00211a9c;
          uVar8 = uVar8 - 1;
          uVar9 = 0x40;
        }
        uVar9 = uVar9 - 1;
        bVar10 = (E->p[uVar8] >> (uVar9 & 0x3f) & 1) != 0;
        idx = (ulong)bVar10;
        uVar7 = CONCAT71((int7)(E->p[uVar8] >> 8),bVar3 || idx != 0);
        bVar4 = bVar3 || idx != 0;
        bVar3 = false;
        if (bVar4) {
          local_c0 = uVar8;
          local_b8 = uVar9;
          local_b0 = uVar7;
          iVar5 = mpi_select((mbedtls_mpi *)&Apos.s,(mbedtls_mpi *)&RR.s,2,0);
          T = local_a8;
          if ((~bVar2 & 1) != 0 || bVar10) {
            if (iVar5 != 0) goto LAB_0021168e;
            mbedtls_mpi_core_montmul
                      ((mbedtls_mpi_uint *)RR._8_8_,(mbedtls_mpi_uint *)RR._8_8_,
                       (mbedtls_mpi_uint *)Apos._8_8_,0,N->p,(ulong)N->n,mm,local_a8);
            iVar5 = mpi_select((mbedtls_mpi *)&Apos.s,(mbedtls_mpi *)&RR.s,2,idx);
            if (iVar5 != 0) goto LAB_0021168e;
            mbedtls_mpi_core_montmul
                      ((mbedtls_mpi_uint *)RR._8_8_,(mbedtls_mpi_uint *)RR._8_8_,
                       (mbedtls_mpi_uint *)Apos._8_8_,0,N->p,(ulong)N->n,mm,T);
          }
          else {
            if (iVar5 != 0) goto LAB_0021168e;
            mbedtls_mpi_core_montmul
                      ((mbedtls_mpi_uint *)RR._8_8_,(mbedtls_mpi_uint *)RR._8_8_,
                       (mbedtls_mpi_uint *)Apos._8_8_,0,N->p,(ulong)N->n,mm,local_a8);
          }
          bVar3 = true;
          uVar7 = local_b0;
          uVar8 = local_c0;
          uVar9 = local_b8;
        }
        goto LAB_0021193b;
      }
    }
  }
LAB_0021168e:
  if (Y._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)Y._8_8_,0);
  }
  Y.s = 0;
  Y.n = 0;
  Y._12_4_ = 0;
  if (RR._8_8_ == 0) {
    Y.p = (mbedtls_mpi_uint *)CONCAT44(Y.p._4_4_,1);
  }
  else {
    mbedtls_zeroize_and_free((void *)RR._8_8_,((ulong)Y.p >> 0x10 & 0xffff) << 3);
    Y.p = (mbedtls_mpi_uint *)CONCAT44(Y.p._4_4_,1);
    RR.s = 0;
    RR.n = 0;
    RR._12_4_ = 0;
    if (Y._8_8_ != 0) {
      mbedtls_zeroize_and_free((void *)Y._8_8_,0);
    }
  }
  Y.s = 0;
  Y.n = 0;
  Y._12_4_ = 0;
  if (local_d0.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_d0.p,(ulong)local_d0.n << 3);
  }
  if (local_a0 != (undefined1  [8])0x0) {
    mbedtls_zeroize_and_free((void *)local_a0,(ulong)Apos.p._2_2_ << 3);
  }
  Apos.p._0_4_ = 1;
  local_a0 = (undefined1  [8])0x0;
  if (Apos._8_8_ != 0) {
    mbedtls_zeroize_and_free((void *)Apos._8_8_,0);
  }
  if (((prec_RR == (mbedtls_mpi *)0x0) || (prec_RR->p == (mbedtls_mpi_uint *)0x0)) &&
     (auStack_78 != (undefined1  [8])0x0)) {
    mbedtls_zeroize_and_free((void *)auStack_78,((ulong)RR.p >> 0x10 & 0xffff) << 3);
  }
  return iVar5;
LAB_00211a9c:
  local_e0 = 1;
  mbedtls_mpi_core_montmul
            ((mbedtls_mpi_uint *)RR._8_8_,(mbedtls_mpi_uint *)RR._8_8_,&local_e0,1,N->p,(ulong)N->n,
             mm,T);
  if (((sVar1 == -1) && (E->n != 0)) && ((*E->p & 1) != 0)) {
    Y.p = (mbedtls_mpi_uint *)CONCAT62(Y.p._2_6_,0xffff);
    iVar5 = add_sub_mpi((mbedtls_mpi *)&RR.s,N,(mbedtls_mpi *)&RR.s,1);
    if (iVar5 != 0) goto LAB_0021168e;
  }
  iVar5 = mbedtls_mpi_copy((mbedtls_mpi *)z,(mbedtls_mpi *)&RR.s);
  goto LAB_0021168e;
}

Assistant:

int mbedtls_mpi_exp_mod(mbedtls_mpi *X, const mbedtls_mpi *A,
                        const mbedtls_mpi *E, const mbedtls_mpi *N,
                        mbedtls_mpi *prec_RR)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t window_bitsize;
    size_t i, j, nblimbs;
    size_t bufsize, nbits;
    size_t exponent_bits_in_window = 0;
    mbedtls_mpi_uint ei, mm, state;
    mbedtls_mpi RR, T, W[(size_t) 1 << MBEDTLS_MPI_WINDOW_SIZE], WW, Apos;
    int neg;

    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(E != NULL);
    MPI_VALIDATE_RET(N != NULL);

    if (mbedtls_mpi_cmp_int(N, 0) <= 0 || (N->p[0] & 1) == 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_cmp_int(E, 0) < 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_bitlen(E) > MBEDTLS_MPI_MAX_BITS ||
        mbedtls_mpi_bitlen(N) > MBEDTLS_MPI_MAX_BITS) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /*
     * Init temps and window size
     */
    mpi_montg_init(&mm, N);
    mbedtls_mpi_init(&RR); mbedtls_mpi_init(&T);
    mbedtls_mpi_init(&Apos);
    mbedtls_mpi_init(&WW);
    memset(W, 0, sizeof(W));

    i = mbedtls_mpi_bitlen(E);

    window_bitsize = (i > 671) ? 6 : (i > 239) ? 5 :
                     (i >  79) ? 4 : (i >  23) ? 3 : 1;

#if (MBEDTLS_MPI_WINDOW_SIZE < 6)
    if (window_bitsize > MBEDTLS_MPI_WINDOW_SIZE) {
        window_bitsize = MBEDTLS_MPI_WINDOW_SIZE;
    }
#endif

    const size_t w_table_used_size = (size_t) 1 << window_bitsize;

    /*
     * This function is not constant-trace: its memory accesses depend on the
     * exponent value. To defend against timing attacks, callers (such as RSA
     * and DHM) should use exponent blinding. However this is not enough if the
     * adversary can find the exponent in a single trace, so this function
     * takes extra precautions against adversaries who can observe memory
     * access patterns.
     *
     * This function performs a series of multiplications by table elements and
     * squarings, and we want the prevent the adversary from finding out which
     * table element was used, and from distinguishing between multiplications
     * and squarings. Firstly, when multiplying by an element of the window
     * W[i], we do a constant-trace table lookup to obfuscate i. This leaves
     * squarings as having a different memory access patterns from other
     * multiplications. So secondly, we put the accumulator in the table as
     * well, and also do a constant-trace table lookup to multiply by the
     * accumulator which is W[x_index].
     *
     * This way, all multiplications take the form of a lookup-and-multiply.
     * The number of lookup-and-multiply operations inside each iteration of
     * the main loop still depends on the bits of the exponent, but since the
     * other operations in the loop don't have an easily recognizable memory
     * trace, an adversary is unlikely to be able to observe the exact
     * patterns.
     *
     * An adversary may still be able to recover the exponent if they can
     * observe both memory accesses and branches. However, branch prediction
     * exploitation typically requires many traces of execution over the same
     * data, which is defeated by randomized blinding.
     */
    const size_t x_index = 0;
    mbedtls_mpi_init(&W[x_index]);

    j = N->n + 1;
    /* All W[i] including the accumulator must have at least N->n limbs for
     * the mpi_montmul() and mpi_montred() calls later. Here we ensure that
     * W[1] and the accumulator W[x_index] are large enough. later we'll grow
     * other W[i] to the same length. They must not be shrunk midway through
     * this function!
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[x_index], j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[1],  j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&T, j * 2));

    /*
     * Compensate for negative A (and correct at the end)
     */
    neg = (A->s == -1);
    if (neg) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&Apos, A));
        Apos.s = 1;
        A = &Apos;
    }

    /*
     * If 1st call, pre-compute R^2 mod N
     */
    if (prec_RR == NULL || prec_RR->p == NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&RR, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&RR, N->n * 2 * biL));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&RR, &RR, N));

        if (prec_RR != NULL) {
            memcpy(prec_RR, &RR, sizeof(mbedtls_mpi));
        }
    } else {
        memcpy(&RR, prec_RR, sizeof(mbedtls_mpi));
    }

    /*
     * W[1] = A * R^2 * R^-1 mod N = A * R mod N
     */
    if (mbedtls_mpi_cmp_mpi(A, N) >= 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&W[1], A, N));
        /* This should be a no-op because W[1] is already that large before
         * mbedtls_mpi_mod_mpi(), but it's necessary to avoid an overflow
         * in mpi_montmul() below, so let's make sure. */
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[1], N->n + 1));
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[1], A));
    }

    /* Note that this is safe because W[1] always has at least N->n limbs
     * (it grew above and was preserved by mbedtls_mpi_copy()). */
    mpi_montmul(&W[1], &RR, N, mm, &T);

    /*
     * W[x_index] = R^2 * R^-1 mod N = R mod N
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[x_index], &RR));
    mpi_montred(&W[x_index], N, mm, &T);


    if (window_bitsize > 1) {
        /*
         * W[i] = W[1] ^ i
         *
         * The first bit of the sliding window is always 1 and therefore we
         * only need to store the second half of the table.
         *
         * (There are two special elements in the table: W[0] for the
         * accumulator/result and W[1] for A in Montgomery form. Both of these
         * are already set at this point.)
         */
        j = w_table_used_size / 2;

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[j], N->n + 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[j], &W[1]));

        for (i = 0; i < window_bitsize - 1; i++) {
            mpi_montmul(&W[j], &W[j], N, mm, &T);
        }

        /*
         * W[i] = W[i - 1] * W[1]
         */
        for (i = j + 1; i < w_table_used_size; i++) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[i], N->n + 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[i], &W[i - 1]));

            mpi_montmul(&W[i], &W[1], N, mm, &T);
        }
    }

    nblimbs = E->n;
    bufsize = 0;
    nbits   = 0;
    state   = 0;

    while (1) {
        if (bufsize == 0) {
            if (nblimbs == 0) {
                break;
            }

            nblimbs--;

            bufsize = sizeof(mbedtls_mpi_uint) << 3;
        }

        bufsize--;

        ei = (E->p[nblimbs] >> bufsize) & 1;

        /*
         * skip leading 0s
         */
        if (ei == 0 && state == 0) {
            continue;
        }

        if (ei == 0 && state == 1) {
            /*
             * out of window, square W[x_index]
             */
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, x_index));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);
            continue;
        }

        /*
         * add ei to current window
         */
        state = 2;

        nbits++;
        exponent_bits_in_window |= (ei << (window_bitsize - nbits));

        if (nbits == window_bitsize) {
            /*
             * W[x_index] = W[x_index]^window_bitsize R^-1 mod N
             */
            for (i = 0; i < window_bitsize; i++) {
                MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size,
                                           x_index));
                mpi_montmul(&W[x_index], &WW, N, mm, &T);
            }

            /*
             * W[x_index] = W[x_index] * W[exponent_bits_in_window] R^-1 mod N
             */
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size,
                                       exponent_bits_in_window));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);

            state--;
            nbits = 0;
            exponent_bits_in_window = 0;
        }
    }

    /*
     * process the remaining bits
     */
    for (i = 0; i < nbits; i++) {
        MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, x_index));
        mpi_montmul(&W[x_index], &WW, N, mm, &T);

        exponent_bits_in_window <<= 1;

        if ((exponent_bits_in_window & ((size_t) 1 << window_bitsize)) != 0) {
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, 1));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);
        }
    }

    /*
     * W[x_index] = A^E * R * R^-1 mod N = A^E mod N
     */
    mpi_montred(&W[x_index], N, mm, &T);

    if (neg && E->n != 0 && (E->p[0] & 1) != 0) {
        W[x_index].s = -1;
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&W[x_index], N, &W[x_index]));
    }

    /*
     * Load the result in the output variable.
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, &W[x_index]));

cleanup:

    /* The first bit of the sliding window is always 1 and therefore the first
     * half of the table was unused. */
    for (i = w_table_used_size/2; i < w_table_used_size; i++) {
        mbedtls_mpi_free(&W[i]);
    }

    mbedtls_mpi_free(&W[x_index]);
    mbedtls_mpi_free(&W[1]);
    mbedtls_mpi_free(&T);
    mbedtls_mpi_free(&Apos);
    mbedtls_mpi_free(&WW);

    if (prec_RR == NULL || prec_RR->p == NULL) {
        mbedtls_mpi_free(&RR);
    }

    return ret;
}